

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O1

MessagePattern * __thiscall
icu_63::MessagePattern::parse
          (MessagePattern *this,UnicodeString *pattern,UParseError *parseError,UErrorCode *errorCode
          )

{
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (parseError != (UParseError *)0x0) {
      parseError->line = 0;
      parseError->offset = 0;
      parseError->preContext[0] = L'\0';
      parseError->postContext[0] = L'\0';
    }
    UnicodeString::operator=(&this->msg,pattern);
    this->partsLength = 0;
    this->numericValuesLength = 0;
    *(undefined4 *)((long)&this->numericValuesLength + 3) = 0;
  }
  parseMessage(this,0,0,0,UMSGPAT_ARG_TYPE_NONE,parseError,errorCode);
  if (this->partsList != (MessagePatternPartsList *)0x0) {
    this->parts = (this->partsList->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.
                  ptr;
  }
  if (this->numericValuesList != (MessagePatternDoubleList *)0x0) {
    this->numericValues = (this->numericValuesList->super_MessagePatternList<double,_8>).a.ptr;
  }
  return this;
}

Assistant:

MessagePattern &
MessagePattern::parse(const UnicodeString &pattern, UParseError *parseError, UErrorCode &errorCode) {
    preParse(pattern, parseError, errorCode);
    parseMessage(0, 0, 0, UMSGPAT_ARG_TYPE_NONE, parseError, errorCode);
    postParse();
    return *this;
}